

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception_assertion_tests.cpp
# Opt level: O0

void __thiscall
iu_Exception_x_iutest_x_ValueNE_Test::Body(iu_Exception_x_iutest_x_ValueNE_Test *this)

{
  bool bVar1;
  undefined4 *puVar2;
  char *message;
  AssertionResult ar_4;
  int *e_4;
  AssertionResult iutest_ar_4;
  AssertionResult ar_3;
  int *e_3;
  AssertionResult iutest_ar_3;
  AssertionResult ar_2;
  int *e_2;
  AssertionResult iutest_ar_2;
  AssertionResult ar_1;
  int *e_1;
  AssertionResult iutest_ar_1;
  Fixed local_210;
  AssertionResult ar;
  int *e;
  undefined1 local_38 [8];
  AssertionResult iutest_ar;
  iu_Exception_x_iutest_x_ValueNE_Test *this_local;
  
  iutest_ar._32_8_ = this;
  iutest::detail::AlwaysZero();
  iutest::AssertionSuccess();
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (bVar1) {
    bVar1 = iutest::detail::AlwaysTrue();
    if (bVar1) {
      puVar2 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar2 = 2;
      __cxa_throw(puVar2,&int::typeinfo,0);
    }
    iutest::AssertionResult::operator<<
              ((AssertionResult *)local_38,
               (char (*) [81])
               "\nExpected: throw 2 throws an exception of type int.\n  Actual: it throws nothing.")
    ;
  }
  memset(&local_210,0,0x188);
  iutest::AssertionHelper::Fixed::Fixed(&local_210);
  message = iutest::AssertionResult::message((AssertionResult *)local_38);
  iutest::AssertionHelper::AssertionHelper
            ((AssertionHelper *)&iutest_ar_1.m_result,
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/exception_assertion_tests.cpp"
             ,0x58,message,kFatalFailure);
  iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_1.m_result,&local_210);
  iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_1.m_result);
  iutest::AssertionHelper::Fixed::~Fixed(&local_210);
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  return;
}

Assistant:

IUTEST(Exception, ValueNE)
{
    IUTEST_ASSERT_THROW_VALUE_NE(throw 2, int, 0);
    IUTEST_ASSERT_THROW_VALUE_NE(ExceptionFunction(1), int, 0);
    IUTEST_EXPECT_THROW_VALUE_NE(ExceptionFunction(1), int, 0);
    IUTEST_INFORM_THROW_VALUE_NE(ExceptionFunction(1), int, 0);
    IUTEST_ASSUME_THROW_VALUE_NE(ExceptionFunction(1), int, 0);
}